

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O3

void __thiscall cmDependsC::Scan(cmDependsC *this,istream *is,char *directory,string *fullName)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  mapped_type pcVar4;
  mapped_type *ppcVar5;
  iterator iVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  UnscannedEntry entry;
  string line;
  allocator local_109;
  string local_108;
  undefined1 local_e8 [32];
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_a8;
  string local_a0;
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *local_80;
  char *local_78;
  _Base_ptr local_70;
  mapped_type local_68;
  RegularExpression *local_60;
  RegularExpression *local_58;
  string local_50;
  
  local_78 = directory;
  pcVar4 = (mapped_type)operator_new(0x20);
  (pcVar4->UnscannedEntries).
  super__Vector_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar4->UnscannedEntries).
  super__Vector_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pcVar4->UnscannedEntries).
  super__Vector_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar4->Used = true;
  ppcVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
            ::operator[](&this->FileCache,fullName);
  *ppcVar5 = pcVar4;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_58 = &this->IncludeRegexLine;
  local_60 = &this->IncludeRegexScan;
  local_a8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->Encountered;
  local_70 = &(this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_80 = &this->Unscanned;
  local_68 = pcVar4;
  do {
    do {
      bVar2 = cmsys::SystemTools::GetLineFromStream(is,&local_a0,(bool *)0x0,-1);
      if (!bVar2) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,
                          CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                                   local_a0.field_2._M_local_buf[0]) + 1);
        }
        return;
      }
      if ((this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        TransformLine(this,&local_a0);
      }
      bVar2 = cmsys::RegularExpression::find(local_58,local_a0._M_dataplus._M_p);
    } while (!bVar2);
    local_e8._0_8_ = local_e8 + 0x10;
    local_e8._8_8_ = 0;
    local_e8[0x10] = '\0';
    local_c8._M_p = (pointer)&local_b8;
    local_c0 = 0;
    local_b8._M_local_buf[0] = '\0';
    pcVar1 = (this->IncludeRegexLine).startp[2];
    if (pcVar1 == (char *)0x0) {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      local_108._M_string_length = 0;
      local_108.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,pcVar1,(this->IncludeRegexLine).endp[2]);
    }
    std::__cxx11::string::operator=((string *)local_e8,(string *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_e8);
    pcVar1 = (this->IncludeRegexLine).startp[3];
    if (pcVar1 == (char *)0x0) {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      local_108._M_string_length = 0;
      local_108.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,pcVar1,(this->IncludeRegexLine).endp[3]);
    }
    iVar3 = std::__cxx11::string::compare((char *)&local_108);
    if (iVar3 == 0) {
      bVar2 = cmsys::SystemTools::FileIsFullPath((char *)local_e8._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,
                        CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                 local_108.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar2) {
        std::__cxx11::string::string((string *)&local_50,local_78,&local_109);
        cmSystemTools::CollapseCombinedPath(&local_108,&local_50,(string *)local_e8);
        std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,
                          CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                   local_108.field_2._M_local_buf[0]) + 1);
        }
        uVar7 = local_50.field_2._M_allocated_capacity;
        _Var8._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_0049f30e;
      }
    }
    else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_108._M_dataplus._M_p != &local_108.field_2) {
      uVar7 = CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                       local_108.field_2._M_local_buf[0]);
      _Var8._M_p = local_108._M_dataplus._M_p;
LAB_0049f30e:
      operator_delete(_Var8._M_p,uVar7 + 1);
    }
    bVar2 = cmsys::RegularExpression::find(local_60,(char *)local_e8._0_8_);
    if (bVar2) {
      std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
      push_back(&local_68->UnscannedEntries,(value_type *)local_e8);
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_a8,(key_type *)local_e8);
      if (iVar6._M_node == local_70) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  (local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_e8);
        std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
        push_back(&local_80->c,(value_type *)local_e8);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &local_b8) {
      operator_delete(local_c8._M_p,
                      CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,CONCAT71(local_e8._17_7_,local_e8[0x10]) + 1);
    }
  } while( true );
}

Assistant:

void cmDependsC::Scan(std::istream& is, const char* directory,
  const std::string& fullName)
{
  cmIncludeLines* newCacheEntry=new cmIncludeLines;
  newCacheEntry->Used=true;
  this->FileCache[fullName]=newCacheEntry;

  // Read one line at a time.
  std::string line;
  while(cmSystemTools::GetLineFromStream(is, line))
    {
    // Transform the line content first.
    if(!this->TransformRules.empty())
      {
      this->TransformLine(line);
      }

    // Match include directives.
    if(this->IncludeRegexLine.find(line.c_str()))
      {
      // Get the file being included.
      UnscannedEntry entry;
      entry.FileName = this->IncludeRegexLine.match(2);
      cmSystemTools::ConvertToUnixSlashes(entry.FileName);
      if(this->IncludeRegexLine.match(3) == "\"" &&
         !cmSystemTools::FileIsFullPath(entry.FileName.c_str()))
        {
        // This was a double-quoted include with a relative path.  We
        // must check for the file in the directory containing the
        // file we are scanning.
        entry.QuotedLocation =
          cmSystemTools::CollapseCombinedPath(directory, entry.FileName);
        }

      // Queue the file if it has not yet been encountered and it
      // matches the regular expression for recursive scanning.  Note
      // that this check does not account for the possibility of two
      // headers with the same name in different directories when one
      // is included by double-quotes and the other by angle brackets.
      // It also does not work properly if two header files with the same
      // name exist in different directories, and both are included from a
      // file their own directory by simply using "filename.h" (#12619)
      // This kind of problem will be fixed when a more
      // preprocessor-like implementation of this scanner is created.
      if (this->IncludeRegexScan.find(entry.FileName.c_str()))
        {
        newCacheEntry->UnscannedEntries.push_back(entry);
        if(this->Encountered.find(entry.FileName) == this->Encountered.end())
          {
          this->Encountered.insert(entry.FileName);
          this->Unscanned.push(entry);
          }
        }
      }
    }
}